

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_test_fixture.cpp
# Opt level: O3

void __thiscall
wallet::WalletTestingSetup::WalletTestingSetup(WalletTestingSetup *this,ChainType chainType)

{
  CWallet *this_00;
  Chain *pCVar1;
  Handler *pHVar2;
  TestOpts opts;
  MockableData records;
  _Alloc_hider _Var3;
  ArgsManager **ppAVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer *__ptr;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff40;
  pointer in_stack_ffffffffffffff48;
  long *in_stack_ffffffffffffff50;
  void *pvVar5;
  size_t sVar6;
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  local_88;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar5 = (void *)0x0;
  sVar6 = 0;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)in_stack_ffffffffffffff40;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_ffffffffffffff38;
  opts.extra_args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = in_stack_ffffffffffffff48;
  opts._24_8_ = in_stack_ffffffffffffff50;
  TestingSetup::TestingSetup(&this->super_TestingSetup,chainType,opts);
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,-(long)pvVar5);
  }
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  ppAVar4 = inline_assertion_check<true,ArgsManager*&>
                      (&(this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.
                        m_node.args,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_test_fixture.cpp"
                       ,0xe,"WalletTestingSetup","m_node.args");
  interfaces::MakeWalletLoader((interfaces *)&this->m_wallet_loader,pCVar1,*ppAVar4);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  local_88._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_88._M_impl.super__Rb_tree_header._M_header;
  local_88._M_impl._0_8_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_88._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_88._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_88._M_impl.super__Rb_tree_header._M_node_count = 0;
  records._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = in_stack_ffffffffffffff40;
  records._M_t._M_impl._0_8_ = in_stack_ffffffffffffff38;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)in_stack_ffffffffffffff48;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       (_Base_ptr)in_stack_ffffffffffffff50;
  records._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)pvVar5;
  records._M_t._M_impl.super__Rb_tree_header._M_node_count = sVar6;
  local_88._M_impl.super__Rb_tree_header._M_header._M_right =
       local_88._M_impl.super__Rb_tree_header._M_header._M_left;
  CreateMockableWalletDatabase((wallet *)&stack0xffffffffffffff50,records);
  this_00 = &this->m_wallet;
  CWallet::CWallet(this_00,pCVar1,&local_50,
                   (unique_ptr<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
                   )&stack0xffffffffffffff50);
  if (in_stack_ffffffffffffff50 != (long *)0x0) {
    (**(code **)(*in_stack_ffffffffffffff50 + 8))();
  }
  std::
  _Rb_tree<std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>,_std::_Select1st<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>,_std::less<void>,_std::allocator<std::pair<const_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>,_std::vector<std::byte,_zero_after_free_allocator<std::byte>_>_>_>_>
  ::~_Rb_tree(&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  (this->m_chain_notifications_handler)._M_t.
  super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
  super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
  super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl = (Handler *)0x0;
  CWallet::LoadWallet(this_00);
  pCVar1 = (this->super_TestingSetup).super_ChainTestingSetup.super_BasicTestingSetup.m_node.chain.
           _M_t.super___uniq_ptr_impl<interfaces::Chain,_std::default_delete<interfaces::Chain>_>.
           _M_t.super__Tuple_impl<0UL,_interfaces::Chain_*,_std::default_delete<interfaces::Chain>_>
           .super__Head_base<0UL,_interfaces::Chain_*,_false>._M_head_impl;
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_0138fbd0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  (*pCVar1->_vptr_Chain[0x29])(&local_50,pCVar1);
  _Var3._M_p = local_50._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)0x0;
  pHVar2 = (this->m_chain_notifications_handler)._M_t.
           super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>.
           _M_t.
           super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
           super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl;
  (this->m_chain_notifications_handler)._M_t.
  super___uniq_ptr_impl<interfaces::Handler,_std::default_delete<interfaces::Handler>_>._M_t.
  super__Tuple_impl<0UL,_interfaces::Handler_*,_std::default_delete<interfaces::Handler>_>.
  super__Head_base<0UL,_interfaces::Handler_*,_false>._M_head_impl = (Handler *)_Var3._M_p;
  if (pHVar2 != (Handler *)0x0) {
    (*pHVar2->_vptr_Handler[1])();
    if ((long *)local_50._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  local_50._M_dataplus._M_p = (pointer)0x0;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  (**(code **)((long)((this->m_wallet_loader)._M_t.
                      super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
                      .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl)->
                     super_ChainClient + 0x10))();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

WalletTestingSetup::WalletTestingSetup(const ChainType chainType)
    : TestingSetup(chainType),
      m_wallet_loader{interfaces::MakeWalletLoader(*m_node.chain, *Assert(m_node.args))},
      m_wallet(m_node.chain.get(), "", CreateMockableWalletDatabase())
{
    m_wallet.LoadWallet();
    m_chain_notifications_handler = m_node.chain->handleNotifications({ &m_wallet, [](CWallet*) {} });
    m_wallet_loader->registerRpcs();
}